

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

void __thiscall
GrcSymbolTableEntry::CreateFeatAltIDSymbol
          (GrcSymbolTableEntry *this,GrcSymbolTable *psymtbl,GdlFeatureDefn *pfeat,
          GdlStringExpression *pexpString)

{
  string staNewSymbol;
  string staValue;
  GrpLineAndFile lnf;
  GrcStructName local_c0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  string local_80;
  string local_60 [32];
  undefined1 local_40 [40];
  
  std::__cxx11::string::string(local_60,(string *)&pexpString->m_staValue);
  GrpLineAndFile::GrpLineAndFile
            ((GrpLineAndFile *)local_40,
             &(pexpString->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject.m_lnf);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  std::__cxx11::string::string((string *)&local_c0,(string *)&pfeat->m_staName);
  std::__cxx11::string::append((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::append((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_80,(string *)&local_a0);
  GrcStructName::GrcStructName(&local_c0,&local_80);
  GrcSymbolTable::AddFeatureAltSymbol(psymtbl,pfeat,&local_c0,(GrpLineAndFile *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.m_vstaFields);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void GrcSymbolTableEntry::CreateFeatAltIDSymbol(GrcSymbolTable * psymtbl, GdlFeatureDefn * pfeat,
	GdlStringExpression * pexpString)
{
	std::string staValue = pexpString->StringValue();
	GrpLineAndFile lnf = pexpString->LineAndFile();
	std::string staNewSymbol;
	staNewSymbol.append(pfeat->Name());
	staNewSymbol.append("__");
	staNewSymbol.append(staValue);
	psymtbl->AddFeatureAltSymbol(pfeat, staNewSymbol, lnf);
}